

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatEntry.cpp
# Opt level: O3

bool __thiscall FatEntry::isCorrect(FatEntry *this)

{
  byte bVar1;
  pointer pcVar2;
  int iVar3;
  ulong uVar4;
  string local_38;
  
  bVar1 = this->attributes;
  if (bVar1 != 0) {
    if ((bVar1 & 0x30) == 0) {
      return false;
    }
    if (((bVar1 & 0x10) != 0) && (this->cluster == 0)) {
      getFilename_abi_cxx11_(&local_38,this);
      iVar3 = std::__cxx11::string::compare((char *)&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
      if (iVar3 != 0) {
        return false;
      }
    }
  }
  pcVar2 = (this->data)._M_dataplus._M_p;
  uVar4 = 0;
  do {
    iVar3 = isprint((uint)(byte)pcVar2[uVar4 + 1]);
    if (iVar3 != 0) {
      return true;
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 != 10);
  return uVar4 < 10;
}

Assistant:

bool FatEntry::isCorrect()
{
    if (attributes && !(attributes&FAT_ATTRIBUTES_DIR) && !(attributes&FAT_ATTRIBUTES_FILE)) {
        return false;
    }

    if (isDirectory() && cluster == 0 && getFilename()!="..") {
        return false;
    }

    for (int i=1; i<11; i++) {
        if (printable(data[i])) {
            return true;
        }
    }

    return false;
}